

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

Vector<int,_3,_true> __thiscall
Nova::Vector<int,_4,_true>::Remove_Index(Vector<int,_4,_true> *this,int index)

{
  int iVar1;
  int *piVar2;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  undefined4 in_register_00000034;
  Vector<int,_3,_true> VVar4;
  bool local_25;
  int local_24;
  int local_20;
  int i_1;
  int i;
  int index_local;
  Vector<int,_4,_true> *this_local;
  Vector<int,_3,_true> *ret;
  
  local_25 = 3 < in_EDX;
  if (local_25) {
    __assert_fail("index>=0 && index<d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Geometry/../Tools/include/nova/Tools/Vectors/Vector.h"
                  ,0x1d2,
                  "Vector<T, d - 1> Nova::Vector<int, 4>::Remove_Index(const int) const [T = int, d = 4, order_ascending = true]"
                 );
  }
  Vector<int,_3,_true>::Vector((Vector<int,_3,_true> *)this);
  uVar3 = extraout_RDX;
  for (local_20 = 0; local_20 < (int)in_EDX; local_20 = local_20 + 1) {
    piVar2 = operator[]((Vector<int,_4,_true> *)CONCAT44(in_register_00000034,index),local_20);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_3,_true>::operator[]((Vector<int,_3,_true> *)this,local_20);
    *piVar2 = iVar1;
    uVar3 = extraout_RDX_00;
  }
  for (local_24 = in_EDX + 1; local_24 < 4; local_24 = local_24 + 1) {
    piVar2 = operator[]((Vector<int,_4,_true> *)CONCAT44(in_register_00000034,index),local_24);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_3,_true>::operator[]((Vector<int,_3,_true> *)this,local_24 + -1);
    *piVar2 = iVar1;
    uVar3 = extraout_RDX_01;
  }
  VVar4._data._M_elems[2] = (int)uVar3;
  VVar4._data._M_elems._0_8_ = this;
  return (Vector<int,_3,_true>)VVar4._data._M_elems;
}

Assistant:

Vector<T,d-1> Remove_Index(const int index) const
    {
        assert(index>=0 && index<d);
        Vector<T,d-1> ret;
        for(int i=0;i<index;++i) ret[i]=(*this)[i];
        for(int i=index+1;i<d;++i) ret[i-1]=(*this)[i];
        return ret;
    }